

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

Iterator<int,_true,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator-=
          (Iterator<int,_true,_std::allocator<unsigned_long>_> *this,difference_type *x)

{
  View<int,_true,_std::allocator<unsigned_long>_> *this_00;
  reference piVar1;
  runtime_error *this_01;
  
  this_00 = this->view_;
  if (this_00 == (View<int,_true,_std::allocator<unsigned_long>_> *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Assertion failed.");
  }
  else {
    if (*x <= (long)this->index_) {
      this->index_ = this->index_ - *x;
      View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(this_00);
      if ((this_00->geometry_).isSimple_ == true) {
        this->pointer_ = this->pointer_ + -*x;
      }
      else {
        piVar1 = View<int,_true,_std::allocator<unsigned_long>_>::operator()
                           (this->view_,this->index_);
        this->pointer_ = piVar1;
        View<int,true,std::allocator<unsigned_long>>::
        indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((View<int,true,std::allocator<unsigned_long>> *)this->view_,this->index_,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )(this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start);
      }
      testInvariant(this);
      return this;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Assertion failed.");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator-=
(
    const difference_type& x
)
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || static_cast<difference_type>(index_) >= x);
    index_ -= x;
    if(view_->isSimple()) {
        pointer_ -= x;
    }
    else {
        pointer_ = &((*view_)(index_));
        view_->indexToCoordinates(index_, coordinates_.begin());
    }
    testInvariant();
    return *this;
}